

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiffdec.c
# Opt level: O1

toff_t MySeek(thandle_t opaque,toff_t offset,int whence)

{
  long lVar1;
  toff_t tVar2;
  ulong uVar3;
  
  if (whence == 0) {
    lVar1 = 0;
  }
  else {
    lVar1 = 0x10;
    if (whence != 1) {
      lVar1 = 8;
    }
    lVar1 = *(long *)((long)opaque + lVar1);
  }
  uVar3 = lVar1 + offset;
  tVar2 = 0xffffffffffffffff;
  if (uVar3 <= *(ulong *)((long)opaque + 8)) {
    *(ulong *)((long)opaque + 0x10) = uVar3;
    tVar2 = uVar3;
  }
  return tVar2;
}

Assistant:

static toff_t MySeek(thandle_t opaque, toff_t offset, int whence) {
  MyData* const my_data = (MyData*)opaque;
  offset += (whence == SEEK_CUR) ? my_data->pos
          : (whence == SEEK_SET) ? 0
          : my_data->size;
  if (offset > my_data->size) return (toff_t)-1;
  my_data->pos = offset;
  return offset;
}